

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall
xLearn::AccMetric::Accumulate
          (AccMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
  *f;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
  *p_Var1;
  ostream *poVar2;
  size_type sVar3;
  vector<float,_std::allocator<float>_> **__args_1;
  reference pvVar4;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t end_idx;
  size_t start_idx;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum;
  allocator_type *in_stack_fffffffffffffe38;
  unsigned_long *__args_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  _func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_uint_ptr_unsigned_long_unsigned_long
  *__f;
  undefined8 in_stack_fffffffffffffe68;
  ThreadPool *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int line;
  string *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  LogSeverity severity;
  ThreadPool *in_stack_fffffffffffffee8;
  ulong uVar5;
  ulong __n;
  int local_a4;
  undefined1 local_9d;
  undefined4 local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  f = (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
       *)std::vector<float,_std::allocator<float>_>::size(in_RSI);
  p_Var1 = (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
            *)std::vector<float,_std::allocator<float>_>::size(local_18);
  if (f != p_Var1) {
    Logger::Logger(&local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Accumulate",&local_79);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffeb8,line,in_stack_fffffffffffffea8);
    poVar2 = std::operator<<(poVar2,"CHECK_EQ failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x84);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"Y.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"pred.size()");
    poVar2 = std::operator<<(poVar2," = ");
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe40);
    abort();
  }
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
  *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + (int)sVar3;
  this_00 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x10);
  local_9c = 0;
  __f = (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_uint_ptr_unsigned_long_unsigned_long
         *)&local_9d;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1eb9d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,in_stack_fffffffffffffe48,(value_type_conflict2 *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1eb9fe);
  for (local_a4 = 0; (ulong)(long)local_a4 < *(ulong *)(in_RDI + 0x10); local_a4 = local_a4 + 1) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    __args_1 = (vector<float,_std::allocator<float>_> **)
               getStart(sVar3,*(size_t *)(in_RDI + 0x10),(long)local_a4);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    in_stack_fffffffffffffe40 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         getEnd(sVar3,*(size_t *)(in_RDI + 0x10),(long)local_a4);
    __args_3 = *(unsigned_long **)(in_RDI + 8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_98,(long)local_a4);
    std::
    bind<void(&)(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long,unsigned_long),std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long&,unsigned_long&>
              (__f,(vector<float,_std::allocator<float>_> **)this_00,__args_1,
               (uint **)in_stack_fffffffffffffe40,__args_3,
               (unsigned_long *)in_stack_fffffffffffffe70);
    ThreadPool::
    enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long,unsigned_long)>>
              (in_stack_fffffffffffffee8,f);
    std::future<void>::~future((future<void> *)0x1ebb58);
  }
  ThreadPool::Sync(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  uVar5 = 0;
  while( true ) {
    __n = uVar5;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
    if (sVar3 <= uVar5) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_98,__n);
    *(value_type *)(in_RDI + 0x1c) = *pvVar4 + *(int *)(in_RDI + 0x1c);
    uVar5 = __n + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<index_t> sum(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(acc_accum_thread,
                               &Y,
                               &pred,
                               &(sum[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum.size(); ++i) {
      true_pred_ += sum[i];
    }
  }